

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjToReal(jx9_value *pObj)

{
  uint uVar1;
  sxu32 nLen;
  char **in_RCX;
  double dVar2;
  double local_18;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 10) == 0) {
      if ((uVar1 & 1) == 0) {
        dVar2 = 0.0;
        if ((uVar1 & 0x20) == 0) {
          if ((uVar1 & 0x40) == 0) {
            if (((uVar1 >> 8 & 1) != 0) && ((pObj->x).iVal != 0)) {
              dVar2 = 1.0;
            }
          }
          else {
            uVar1 = ((jx9_hashmap *)(pObj->x).pOther)->nEntry;
            jx9HashmapUnref((jx9_hashmap *)(pObj->x).pOther);
            dVar2 = (double)uVar1;
          }
        }
      }
      else {
        local_18 = 0.0;
        nLen = (pObj->sBlob).nByte;
        if (nLen == 0) {
          dVar2 = 0.0;
        }
        else {
          SyStrToReal((char *)(pObj->sBlob).pBlob,nLen,&local_18,in_RCX);
          dVar2 = local_18;
        }
      }
    }
    else {
      dVar2 = (double)(pObj->x).iVal;
    }
    (pObj->x).rVal = dVar2;
    SyBlobRelease(&pObj->sBlob);
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 4;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToReal(jx9_value *pObj)
{
	if((pObj->iFlags & MEMOBJ_REAL) == 0 ){
		/* Preform the conversion */
		pObj->x.rVal = MemObjRealValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_REAL);
	}
	return SXRET_OK;
}